

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O2

void Cba_BlastShiftLeft(Gia_Man_t *pNew,int *pNum,int nNum,int *pShift,int nShift,int fSticky,
                       Vec_Int_t *vRes)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int local_64;
  
  piVar4 = Cba_VecCopy(vRes,pNum,nNum);
  uVar7 = 0;
  local_64 = 0;
  if (fSticky != 0) {
    local_64 = *pNum;
  }
  uVar1 = 0x20;
  if (nShift < 0x20) {
    uVar1 = nShift;
  }
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = uVar7;
  }
  for (uVar8 = 0; uVar8 != uVar5; uVar8 = uVar8 + 1) {
    iVar2 = 1 << ((byte)uVar8 & 0x1f);
    for (lVar6 = (long)nNum; fSticky < lVar6; lVar6 = lVar6 + -1) {
      if (((int)uVar7 == 0) && (iVar2 < lVar6)) {
        iVar3 = Gia_ManHashMux(pNew,pShift[uVar8],piVar4[(lVar6 + -1) - (long)iVar2],
                               piVar4[lVar6 + -1]);
        piVar4[lVar6 + -1] = iVar3;
        uVar7 = 0;
      }
      else {
        iVar3 = Gia_ManHashMux(pNew,pShift[uVar8],local_64,piVar4[lVar6 + -1]);
        piVar4[lVar6 + -1] = iVar3;
        if (nNum < iVar2) {
          uVar7 = 1;
        }
      }
    }
  }
  return;
}

Assistant:

void Cba_BlastShiftLeft( Gia_Man_t * pNew, int * pNum, int nNum, int * pShift, int nShift, int fSticky, Vec_Int_t * vRes )
{
    int * pRes = Cba_VecCopy( vRes, pNum, nNum );
    int Fill = fSticky ? pNum[0] : 0;
    int i, j, fShort = 0;
    if ( nShift > 32 )
        nShift = 32;
    assert( nShift <= 32 );
    for( i = 0; i < nShift; i++ ) 
        for( j = nNum-1; j >= fSticky; j-- ) 
        {
            if( fShort || (1<<i) > j ) 
            {
                pRes[j] = Gia_ManHashMux( pNew, pShift[i], Fill, pRes[j] );
                if ( (1<<i) > nNum ) 
                    fShort = 1;
            } 
            else 
                pRes[j] = Gia_ManHashMux( pNew, pShift[i], pRes[j-(1<<i)], pRes[j] );
        }
}